

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_extdata.c
# Opt level: O3

int cmd_extdata_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  char ***argv_p;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined **ppuVar4;
  undefined8 *puVar5;
  int argc;
  int opt_index;
  option options [3];
  int local_ac;
  int *local_a8;
  undefined1 local_9c [4];
  undefined8 local_98 [13];
  
  local_ac = 0;
  ppuVar4 = &PTR_anon_var_dwarf_32a8_0011c8f0;
  puVar5 = local_98;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *ppuVar4;
    ppuVar4 = ppuVar4 + 1;
    puVar5 = puVar5 + 1;
  }
  argv_p = &yo->argv;
  iVar1 = parse_cmdline(cmdline,&local_ac,argv_p);
  if (iVar1 == 0) {
    local_a8 = posc;
    while( true ) {
      iVar2 = getopt_long(local_ac,*argv_p,commands[8].optstring,local_98,local_9c);
      iVar1 = _optind;
      if (iVar2 != 99) break;
      yo->extdata_unset = '\x01';
      free(filename);
      filename = (char *)0x0;
    }
    if (iVar2 == -1) {
      *posv = *argv_p + _optind;
      *local_a8 = local_ac - iVar1;
      iVar1 = 0;
    }
    else if (iVar2 == 0x68) {
      puts(
          "Usage: extdata [--clear] [<extdata-file-path>]\n                 File containing the specific data required by an extension. Required by\n                 the schema-mount extension, for example, when the operational data are\n                 expected in the file. File format is guessed."
          );
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      yl_log('\x01',"Unknown option.");
    }
  }
  return iVar1;
}

Assistant:

int
cmd_extdata_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"clear", no_argument, NULL, 'c'},
        {"help", no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_EXTDATA].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'c':
            yo->extdata_unset = 1;
            free(filename);
            filename = NULL;
            break;
        case 'h':
            cmd_extdata_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return 0;
}